

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_typename.cpp
# Opt level: O2

vector<duckdb::Value,_true> * __thiscall
duckdb::Transformer::TransformTypeModifiers
          (vector<duckdb::Value,_true> *__return_storage_ptr__,Transformer *this,
          PGTypeName *type_name)

{
  char *pcVar1;
  PGAConst *pPVar2;
  pointer pCVar3;
  ParserException *pPVar4;
  PGValue *pPVar5;
  anon_union_8_3_7edaf945_for_data *paVar6;
  PGValue val;
  allocator local_51;
  anon_union_8_3_7edaf945_for_data local_50 [4];
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  paVar6 = (anon_union_8_3_7edaf945_for_data *)type_name->typmods;
  if (paVar6 != (anon_union_8_3_7edaf945_for_data *)0x0) {
    while (paVar6 = (anon_union_8_3_7edaf945_for_data *)paVar6[1].ptr_value,
          paVar6 != (anon_union_8_3_7edaf945_for_data *)0x0) {
      if (0x240 < (ulong)((long)(__return_storage_ptr__->
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
        local_50[0] = type_name->names->tail->data;
        pPVar5 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_50);
        pcVar1 = (pPVar5->val).str;
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_50,"\'%s\': a maximum of 9 type modifiers is allowed",&local_51);
        ParserException::ParserException<char>(pPVar4,(string *)local_50,*pcVar1);
        __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50[0] = (anon_union_8_3_7edaf945_for_data)paVar6->ptr_value;
      pPVar2 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_50);
      if (pPVar2->type != T_PGAConst) {
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_50,"Expected a constant as type modifier",&local_51);
        ParserException::ParserException(pPVar4,(string *)local_50);
        __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      val.val.ival._0_4_ = (pPVar2->val).type;
      val._0_8_ = this;
      val.val.ival._4_4_ = 0;
      TransformValue((Transformer *)local_50,val);
      pCVar3 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
               ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                             *)local_50);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__,
                 &pCVar3->value);
      if ((long *)local_50[0].ptr_value != (long *)0x0) {
        (**(code **)(*local_50[0].ptr_value + 8))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Value> Transformer::TransformTypeModifiers(duckdb_libpgquery::PGTypeName &type_name) {
	vector<Value> type_mods;
	if (type_name.typmods) {
		for (auto node = type_name.typmods->head; node; node = node->next) {
			if (type_mods.size() > 9) {
				const auto &name =
				    *PGPointerCast<duckdb_libpgquery::PGValue>(type_name.names->tail->data.ptr_value)->val.str;
				throw ParserException("'%s': a maximum of 9 type modifiers is allowed", name);
			}
			const auto &const_val = *PGPointerCast<duckdb_libpgquery::PGAConst>(node->data.ptr_value);
			if (const_val.type != duckdb_libpgquery::T_PGAConst) {
				throw ParserException("Expected a constant as type modifier");
			}
			const auto const_expr = TransformValue(const_val.val);
			type_mods.push_back(std::move(const_expr->value));
		}
	}
	return type_mods;
}